

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

void Ifn_NtkMatchCollectConfig(Ifn_Ntk_t *p,sat_solver *pSat,word *pConfig)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  iVar1 = p->nParsVNum;
  if (iVar1 < 5) {
    for (uVar5 = 0; (int)uVar5 < p->nInps; uVar5 = uVar5 + 1) {
      uVar3 = 0;
      for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
        iVar1 = sat_solver_var_value(pSat,iVar1 * uVar5 + p->nParsVIni + iVar4);
        uVar2 = 1 << ((byte)iVar4 & 0x1f);
        if (iVar1 == 0) {
          uVar2 = 0;
        }
        uVar3 = uVar3 | uVar2;
        iVar1 = p->nParsVNum;
      }
      pConfig[uVar5 >> 4] = pConfig[uVar5 >> 4] | (long)(int)uVar3 << ((char)uVar5 * '\x04' & 0x3fU)
      ;
    }
    for (iVar1 = p->nObjs; iVar1 < p->nParsVIni; iVar1 = iVar1 + 1) {
      iVar4 = sat_solver_var_value(pSat,iVar1);
      if (iVar4 != 0) {
        iVar4 = iVar1 - p->nObjs;
        pConfig[(long)(iVar4 >> 6) + 1] =
             pConfig[(long)(iVar4 >> 6) + 1] | 1L << ((byte)iVar4 & 0x3f);
      }
    }
    return;
  }
  __assert_fail("p->nParsVNum <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                ,0x51c,"void Ifn_NtkMatchCollectConfig(Ifn_Ntk_t *, sat_solver *, word *)");
}

Assistant:

void Ifn_NtkMatchCollectConfig( Ifn_Ntk_t * p, sat_solver * pSat, word * pConfig )
{
    int i, v, Mint;
    assert( p->nParsVNum <= 4 );
    for ( i = 0; i < p->nInps; i++ )
    {
        for ( Mint = v = 0; v < p->nParsVNum; v++ )
            if ( sat_solver_var_value(pSat, p->nParsVIni + i * p->nParsVNum + v) )
                Mint |= (1 << v);
        Abc_TtSetHex( pConfig, i, Mint );
    }
    for ( v = p->nObjs; v < p->nParsVIni; v++ )
        if ( sat_solver_var_value(pSat, v) )
            Abc_TtSetBit( pConfig + 1, v - p->nObjs );
}